

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O0

void string(Vm *vm,_Bool quotation_marks)

{
  char **ppcVar1;
  HTItemKey key_00;
  ValueType VVar2;
  uint32_t uVar3;
  CrispyValue value_00;
  CrispyValue CVar4;
  uint8_t index_2;
  uint8_t index_1;
  uint16_t pos;
  ulong local_58;
  CrispyValue value;
  ObjString *string;
  CrispyValue item;
  HTItemKey key;
  Compiler *compiler;
  _Bool quotation_marks_local;
  Vm *vm_local;
  
  ppcVar1 = &(vm->compiler).token.start;
  key_00 = *(HTItemKey *)ppcVar1;
  CVar4 = ht_get(&vm->strings,*(HTItemKey *)ppcVar1);
  if (CVar4.type == NIL) {
    if (quotation_marks) {
      value.field_1.o_value =
           &new_string(vm,(vm->compiler).token.start + 1,(vm->compiler).token.length - 2)->object;
    }
    else {
      value.field_1.o_value =
           &new_string(vm,(vm->compiler).token.start,(vm->compiler).token.length)->object;
    }
    CVar4 = create_object(value.field_1.o_value);
    value._0_8_ = CVar4.field_1;
    VVar2 = CVar4.type;
    CVar4._4_4_ = 0;
    CVar4.type = VVar2;
    CVar4.field_1.p_value = value._0_8_;
    ht_put(&vm->strings,key_00,CVar4);
  }
  else {
    CVar4 = create_object(CVar4.field_1.o_value);
    value._0_8_ = CVar4.field_1;
    VVar2 = CVar4.type;
  }
  local_58 = CONCAT44(0,VVar2);
  value_00.field_1 = (anon_union_8_3_4e733eb7_for_CrispyValue_1)value._0_8_;
  value_00._0_8_ = local_58;
  uVar3 = add_constant(vm,value_00);
  if ((ushort)uVar3 < 0x100) {
    emit_byte_arg(vm,OP_LDC,(uint8_t)uVar3);
  }
  else {
    emit_short_arg(vm,OP_LDC_W,(uint8_t)(uVar3 >> 8),(uint8_t)uVar3);
  }
  return;
}

Assistant:

static Token string(Scanner *scanner, char quotation_mark) {
    while (!at_end(scanner) && peek(scanner) != quotation_mark) {
        advance(scanner);
    }

    if (at_end(scanner)) {
        return error_token(scanner, "Unterminated String");
    }

    advance(scanner);
    return make_token(scanner, TOKEN_STRING);
}